

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cxx
# Opt level: O0

DisplayAction *
setUsedDimensions(DisplayAction *__return_storage_ptr__,
                 vector<unsigned_int,_std::allocator<unsigned_int>_> *dimensions)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  offset_in_Display_to_subr in_R9;
  string local_1d8;
  uint local_1a4;
  stringstream local_1a0 [4];
  uint i;
  stringstream s;
  ostream local_190;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *dimensions_local;
  
  local_18 = dimensions;
  dimensions_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1a4 = 0;
  while( true ) {
    uVar1 = (ulong)local_1a4;
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_18);
    if (sVar2 <= uVar1) break;
    if (local_1a4 != 0) {
      std::operator<<(&local_190,':');
    }
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (local_18,(ulong)local_1a4);
    std::ostream::operator<<(&local_190,*pvVar3);
    local_1a4 = local_1a4 + 1;
  }
  std::__cxx11::stringstream::str();
  DisplayAction::DisplayAction(__return_storage_ptr__,0,&local_1d8,0,0,in_R9);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

DisplayAction setUsedDimensions( const vector<uint> &dimensions)
{
	stringstream s;
	for (uint i=0; i<dimensions.size(); ++i) {
		if (i) s << ':';
		s << dimensions[i];
	}
	return DisplayAction(0, s.str(), 0, 0, &Display::setUsedDimensions);
}